

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaTargetGenerator::GetCompiledSourceNinjaPath_abi_cxx11_
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source)

{
  string *psVar1;
  string local_40;
  cmSourceFile *local_20;
  cmSourceFile *source_local;
  cmNinjaTargetGenerator *this_local;
  
  local_20 = source;
  source_local = (cmSourceFile *)this;
  this_local = (cmNinjaTargetGenerator *)__return_storage_ptr__;
  psVar1 = cmSourceFile::GetFullPath_abi_cxx11_(source);
  std::__cxx11::string::string((string *)&local_40,(string *)psVar1);
  ConvertToNinjaAbsPath(__return_storage_ptr__,this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::GetCompiledSourceNinjaPath(
  cmSourceFile const* source) const
{
  // Pass source files to the compiler by absolute path.
  return this->ConvertToNinjaAbsPath(source->GetFullPath());
}